

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::PushDot(ParseState *this)

{
  bool bVar1;
  ParseFlags PVar2;
  ParseFlags b;
  Regexp *this_00;
  CharClassBuilder *this_01;
  Regexp *re;
  ParseState *this_local;
  
  PVar2 = operator&(this->flags_,DotNL);
  if ((PVar2 != NoParseFlags) && (PVar2 = operator&(this->flags_,NeverNL), PVar2 == NoParseFlags)) {
    bVar1 = PushSimpleOp(this,kRegexpAnyChar);
    return bVar1;
  }
  this_00 = (Regexp *)operator_new(0x28);
  PVar2 = this->flags_;
  b = operator~(FoldCase);
  PVar2 = operator&(PVar2,b);
  Regexp(this_00,kRegexpCharClass,PVar2);
  this_01 = (CharClassBuilder *)operator_new(0x40);
  CharClassBuilder::CharClassBuilder(this_01);
  (this_00->field_7).field_3.ccb_ = this_01;
  CharClassBuilder::AddRange((this_00->field_7).field_3.ccb_,0,9);
  CharClassBuilder::AddRange((this_00->field_7).field_3.ccb_,0xb,this->rune_max_);
  bVar1 = PushRegexp(this,this_00);
  return bVar1;
}

Assistant:

bool Regexp::ParseState::PushDot() {
  if ((flags_ & DotNL) && !(flags_ & NeverNL))
    return PushSimpleOp(kRegexpAnyChar);
  // Rewrite . into [^\n]
  Regexp* re = new Regexp(kRegexpCharClass, flags_ & ~FoldCase);
  re->ccb_ = new CharClassBuilder;
  re->ccb_->AddRange(0, '\n' - 1);
  re->ccb_->AddRange('\n' + 1, rune_max_);
  return PushRegexp(re);
}